

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O0

void yy_parse_failed(yyParser *yypParser)

{
  ulong *in_RDI;
  ztparseinfo_t *info;
  yyParser *pParser;
  
  pParser = (yyParser *)in_RDI[2];
  while (in_RDI + 3 < (ulong *)*in_RDI) {
    yy_pop_parser_stack(pParser);
  }
  in_RDI[2] = (ulong)pParser;
  return;
}

Assistant:

static void yy_parse_failed(
  yyParser *yypParser           /* The parser */
){
  ztparseARG_FETCH
  ztparseCTX_FETCH
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sFail!\n",yyTracePrompt);
  }
#endif
  while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
  /* Here code is inserted which will be executed whenever the
  ** parser fails */
/************ Begin %parse_failure code ***************************************/
/************ End %parse_failure code *****************************************/
  ztparseARG_STORE /* Suppress warning about unused %extra_argument variable */
  ztparseCTX_STORE
}